

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MeshTopology::IsValid(ON_MeshTopology *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_MeshTopology *pOVar4;
  int *piVar5;
  ON_3fPoint *b;
  ON_MeshTopologyEdge *pOVar6;
  ON_MeshTopologyVertex *pOVar7;
  ON_MeshTopologyFace *pOVar8;
  ON_MeshFace *this_00;
  float *pfVar9;
  ON_MeshTopologyEdge *tope_2;
  ON_MeshFace *f;
  ON_MeshTopologyFace *topf_1;
  ON_MeshTopologyFace *topf;
  ON_MeshTopologyVertex *topv1;
  ON_MeshTopologyVertex *topv0;
  ON_MeshTopologyEdge *tope_1;
  ON_MeshTopologyVertex *topv_1;
  ON_MeshTopologyEdge *tope;
  ON_MeshTopologyVertex *local_98;
  ON_MeshTopologyVertex *topv;
  char *vCheck;
  int topf_count;
  int tope_count;
  int topv_count;
  int f_count;
  int v_count;
  undefined4 local_68;
  undefined1 local_64 [8];
  ON_3fPoint p;
  int tfvi [4];
  int k;
  int jmax;
  int j;
  int fi;
  int vi;
  int topfi;
  int topei;
  int topvi;
  ON_Workspace ws;
  ON_MeshTopology *this_local;
  
  ws.m_pMemBlk = (ON_Workspace_MBLK *)this;
  ON_Workspace::ON_Workspace((ON_Workspace *)&topei);
  WaitUntilReady(this,0);
  if (this->m_b32IsValid == 1) {
    if (this->m_mesh == (ON_Mesh *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      pOVar4 = ON_Mesh::Topology(this->m_mesh);
      if (this == pOVar4) {
        topv_count = ON_Mesh::VertexCount(this->m_mesh);
        tope_count = ON_Mesh::FaceCount(this->m_mesh);
        topf_count = TopVertexCount(this);
        vCheck._4_4_ = TopEdgeCount(this);
        vCheck._0_4_ = TopFaceCount(this);
        if ((topv_count < topf_count) || (topf_count < 0)) {
          this_local._7_1_ = false;
        }
        else if ((topf_count == 0) && (0 < topv_count)) {
          this_local._7_1_ = false;
        }
        else if ((int)vCheck == tope_count) {
          if ((tope_count < 1) || (2 < vCheck._4_4_)) {
            iVar2 = ON_SimpleArray<int>::Count(&this->m_topv_map);
            if (iVar2 == topv_count) {
              for (j = 0; j < topv_count; j = j + 1) {
                piVar5 = ON_SimpleArray<int>::operator[](&this->m_topv_map,j);
                if ((*piVar5 < 0) || (topf_count <= *piVar5)) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
              }
              topv = (ON_MeshTopologyVertex *)
                     ON_Workspace::GetMemory((ON_Workspace *)&topei,(long)topv_count);
              memset(topv,0,(long)topv_count);
              for (topfi = 0; topfi < topf_count; topfi = topfi + 1) {
                local_98 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[](&this->m_topv,topfi);
                if (local_98->m_v_count < 1) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                if (local_98->m_vi == (int *)0x0) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                TopVertexPoint((ON_3dPoint *)&tope,this,topfi);
                ON_3fPoint::operator=((ON_3fPoint *)local_64,(ON_3dPoint *)&tope);
                for (k = 0; k < local_98->m_v_count; k = k + 1) {
                  iVar2 = local_98->m_vi[k];
                  if (iVar2 < 0) {
                    this_local._7_1_ = false;
                    goto LAB_0072365e;
                  }
                  if (topv_count <= iVar2) {
                    this_local._7_1_ = false;
                    goto LAB_0072365e;
                  }
                  if (*(char *)((long)&topv->m_tope_count + (long)iVar2) != '\0') {
                    this_local._7_1_ = false;
                    goto LAB_0072365e;
                  }
                  b = ON_SimpleArray<ON_3fPoint>::operator[]
                                (&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>,iVar2);
                  iVar3 = compare3fPoint((ON_3fPoint *)local_64,b);
                  if (iVar3 != 0) {
                    this_local._7_1_ = false;
                    goto LAB_0072365e;
                  }
                  piVar5 = ON_SimpleArray<int>::operator[](&this->m_topv_map,iVar2);
                  if (*piVar5 != topfi) {
                    this_local._7_1_ = false;
                    goto LAB_0072365e;
                  }
                  *(undefined1 *)((long)&topv->m_tope_count + (long)iVar2) = 1;
                }
                if (local_98->m_tope_count < 0) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                if ((local_98->m_tope_count == 0) && (local_98->m_topei != (int *)0x0)) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                if ((0 < local_98->m_tope_count) && (local_98->m_topei == (int *)0x0)) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                for (k = 0; k < local_98->m_tope_count; k = k + 1) {
                  iVar2 = local_98->m_topei[k];
                  if (iVar2 < 0) {
                    this_local._7_1_ = false;
                    goto LAB_0072365e;
                  }
                  if (vCheck._4_4_ <= iVar2) {
                    this_local._7_1_ = false;
                    goto LAB_0072365e;
                  }
                  pOVar6 = ON_SimpleArray<ON_MeshTopologyEdge>::operator[](&this->m_tope,iVar2);
                  if ((pOVar6->m_topvi[0] != topfi) && (pOVar6->m_topvi[1] != topfi)) {
                    this_local._7_1_ = false;
                    goto LAB_0072365e;
                  }
                  for (tfvi[2] = 0; tfvi[2] < k; tfvi[2] = tfvi[2] + 1) {
                    if (local_98->m_topei[tfvi[2]] == iVar2) {
                      this_local._7_1_ = false;
                      goto LAB_0072365e;
                    }
                  }
                }
              }
              for (j = 0; j < topv_count; j = j + 1) {
                if (*(char *)((long)&topv->m_tope_count + (long)j) != '\x01') {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                piVar5 = ON_SimpleArray<int>::operator[](&this->m_topv_map,j);
                iVar2 = *piVar5;
                if (iVar2 < 0) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                if (topf_count <= iVar2) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                pOVar7 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[](&this->m_topv,iVar2);
                for (k = 0; (k < pOVar7->m_v_count && (pOVar7->m_vi[k] != j)); k = k + 1) {
                }
                if (pOVar7->m_v_count <= k) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
              }
              for (vi = 0; vi < vCheck._4_4_; vi = vi + 1) {
                pOVar6 = ON_SimpleArray<ON_MeshTopologyEdge>::operator[](&this->m_tope,vi);
                if ((pOVar6->m_topvi[0] < 0) || (topf_count <= pOVar6->m_topvi[0])) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                if ((pOVar6->m_topvi[1] < 0) || (topf_count <= pOVar6->m_topvi[1])) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                if (pOVar6->m_topvi[0] == pOVar6->m_topvi[1]) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                pOVar7 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[]
                                   (&this->m_topv,pOVar6->m_topvi[0]);
                for (k = 0; (k < pOVar7->m_tope_count && (pOVar7->m_topei[k] != vi)); k = k + 1) {
                }
                if (pOVar7->m_tope_count <= k) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                pOVar7 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[]
                                   (&this->m_topv,pOVar6->m_topvi[1]);
                for (k = 0; (k < pOVar7->m_tope_count && (pOVar7->m_topei[k] != vi)); k = k + 1) {
                }
                if (pOVar7->m_tope_count <= k) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                if (pOVar6->m_topf_count < 0) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                if ((pOVar6->m_topf_count == 0) && (pOVar6->m_topfi != (int *)0x0)) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                if ((0 < pOVar6->m_topf_count) && (pOVar6->m_topfi == (int *)0x0)) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                for (k = 0; k < pOVar6->m_topf_count; k = k + 1) {
                  iVar2 = pOVar6->m_topfi[k];
                  if ((iVar2 < 0) || (tope_count <= iVar2)) {
                    this_local._7_1_ = false;
                    goto LAB_0072365e;
                  }
                  pOVar8 = ON_SimpleArray<ON_MeshTopologyFace>::operator[](&this->m_topf,iVar2);
                  for (tfvi[2] = 0; (tfvi[2] < 4 && (pOVar8->m_topei[tfvi[2]] != vi));
                      tfvi[2] = tfvi[2] + 1) {
                  }
                  if (3 < tfvi[2]) {
                    this_local._7_1_ = false;
                    goto LAB_0072365e;
                  }
                }
              }
              for (jmax = 0; jmax < tope_count; jmax = jmax + 1) {
                pOVar8 = ON_SimpleArray<ON_MeshTopologyFace>::operator[](&this->m_topf,jmax);
                this_00 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_mesh->m_F,jmax);
                if ((pOVar8->m_topei[0] < 0) || (vCheck._4_4_ <= pOVar8->m_topei[0])) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                if ((pOVar8->m_topei[1] < 0) || (vCheck._4_4_ <= pOVar8->m_topei[1])) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                if ((pOVar8->m_topei[2] < 0) || (vCheck._4_4_ <= pOVar8->m_topei[2])) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                if ((pOVar8->m_topei[3] < 0) || (vCheck._4_4_ <= pOVar8->m_topei[3])) {
                  this_local._7_1_ = false;
                  goto LAB_0072365e;
                }
                pfVar9 = (float *)ON_SimpleArray<int>::operator[](&this->m_topv_map,this_00->vi[0]);
                p.y = *pfVar9;
                pfVar9 = (float *)ON_SimpleArray<int>::operator[](&this->m_topv_map,this_00->vi[1]);
                p.z = *pfVar9;
                ON_SimpleArray<int>::operator[](&this->m_topv_map,this_00->vi[2]);
                ON_SimpleArray<int>::operator[](&this->m_topv_map,this_00->vi[3]);
                if ((((pOVar8->m_topei[0] == 0) && (pOVar8->m_topei[1] == 0)) &&
                    (pOVar8->m_topei[2] == 0)) && (pOVar8->m_topei[3] == 0)) {
                  if (((pOVar8->m_topei[0] != 0) || (pOVar8->m_topei[1] != 0)) ||
                     ((pOVar8->m_topei[2] != 0 || (pOVar8->m_topei[3] != 0)))) {
                    this_local._7_1_ = false;
                    goto LAB_0072365e;
                  }
                }
                else {
                  bVar1 = ON_MeshFace::IsValid(this_00,topv_count);
                  if (!bVar1) {
                    this_local._7_1_ = false;
                    goto LAB_0072365e;
                  }
                  bVar1 = ON_MeshFace::IsTriangle(this_00);
                  if (bVar1) {
                    if (pOVar8->m_topei[2] != pOVar8->m_topei[3]) {
                      this_local._7_1_ = false;
                      goto LAB_0072365e;
                    }
                    tfvi[3] = 3;
                  }
                  else {
                    if (pOVar8->m_topei[2] == pOVar8->m_topei[3]) {
                      this_local._7_1_ = false;
                      goto LAB_0072365e;
                    }
                    tfvi[3] = 4;
                  }
                  for (k = 0; k < tfvi[3]; k = k + 1) {
                    pOVar6 = ON_SimpleArray<ON_MeshTopologyEdge>::operator[]
                                       (&this->m_tope,pOVar8->m_topei[k]);
                    for (tfvi[2] = 0;
                        (tfvi[2] < pOVar6->m_topf_count && (pOVar6->m_topfi[tfvi[2]] != jmax));
                        tfvi[2] = tfvi[2] + 1) {
                    }
                    if (pOVar6->m_topf_count <= tfvi[2]) {
                      this_local._7_1_ = false;
                      goto LAB_0072365e;
                    }
                    if (pOVar8->m_reve[k] == '\0') {
                      if (pOVar6->m_topvi[0] != tfvi[(long)((k + 3) % 4) + -2]) {
                        this_local._7_1_ = false;
                        goto LAB_0072365e;
                      }
                      if (pOVar6->m_topvi[1] != tfvi[(long)k + -2]) {
                        this_local._7_1_ = false;
                        goto LAB_0072365e;
                      }
                    }
                    else {
                      if (pOVar6->m_topvi[1] != tfvi[(long)((k + 3) % 4) + -2]) {
                        this_local._7_1_ = false;
                        goto LAB_0072365e;
                      }
                      if (pOVar6->m_topvi[0] != tfvi[(long)k + -2]) {
                        this_local._7_1_ = false;
                        goto LAB_0072365e;
                      }
                    }
                  }
                }
              }
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_0072365e:
  local_68 = 1;
  ON_Workspace::~ON_Workspace((ON_Workspace *)&topei);
  return this_local._7_1_;
}

Assistant:

bool ON_MeshTopology::IsValid() const
{
  ON_Workspace ws;
  int topvi, topei, topfi, vi, fi, j, jmax, k, tfvi[4];
  ON_3fPoint p;

  WaitUntilReady(0);

  // simple checks
  if ( 1 != m_b32IsValid )
    return false;
  if ( !m_mesh )
    return false;
  if ( this != &(m_mesh->Topology()) )
    return false;
  const int v_count = m_mesh->VertexCount();
  const int f_count = m_mesh->FaceCount();
  const int topv_count = TopVertexCount();
  const int tope_count = TopEdgeCount();
  const int topf_count = TopFaceCount();
  if ( topv_count > v_count || topv_count < 0 )
    return false;
  if ( topv_count == 0 && v_count > 0 )
    return false;
  if ( topf_count != f_count )
    return false;
  if ( f_count > 0 && tope_count < 3 )
    return false;
  if ( m_topv_map.Count() != v_count )
    return false;

  // check vertex information
  for ( vi = 0; vi < v_count; vi++ ) {
    topvi = m_topv_map[vi];
    if ( topvi < 0 || topvi >= topv_count )
      return false;
  }

  char* vCheck = (char*)ws.GetMemory( v_count*sizeof(*vCheck) );
  memset( vCheck, 0, v_count*sizeof(*vCheck) );
  for ( topvi = 0; topvi < topv_count; topvi++ )
  {
    const ON_MeshTopologyVertex& topv = m_topv[topvi];
    if ( topv.m_v_count <= 0 )
      return false;
    if ( !topv.m_vi )
      return false;
    p = TopVertexPoint(topvi);
    for ( j = 0; j < topv.m_v_count; j++ ) {
      vi = topv.m_vi[j];
      if ( vi < 0 )
        return false;
      if ( vi >= v_count )
        return false;
      if ( vCheck[vi] != 0 )
        return false; // mesh.m_V[vi] is referenced multiple times
      if ( compare3fPoint( &p, &m_mesh->m_V[vi] ) )
        return false; // mesh.m_V[vi] not at same location as topv
      if ( m_topv_map[vi] != topvi )
        return false; 
      vCheck[vi] = 1;
    }

    // check that edges in m_topei[] list have topvi has a start/end
    if ( topv.m_tope_count < 0 )
      return false;
    if ( topv.m_tope_count == 0 && topv.m_topei )
      return false; // array should be nullptr
    if ( topv.m_tope_count > 0 && !topv.m_topei )
      return false; // array should not be nullptr
    for ( j = 0; j < topv.m_tope_count; j++ ) {
      topei = topv.m_topei[j];
      if ( topei < 0 )
        return false;
      if ( topei >= tope_count )
        return false;
      const ON_MeshTopologyEdge& tope = m_tope[topei];
      if ( tope.m_topvi[0] != topvi && tope.m_topvi[1] != topvi )
        return false; // edge doesn't reference this top vtx
      for ( k = 0; k < j; k++ ) {
        if ( topv.m_topei[k] == topei )
          return false; // edge listed multiple times
      }
    }
  }

  // make sure every mesh.m_V[] maps to a topological vertex
  for ( vi = 0; vi < v_count; vi++ ) {
    if ( vCheck[vi] != 1 )
      return false; // mesh.m_V[vi] is not referenced
    topvi = m_topv_map[vi];
    if ( topvi < 0 )
      return false;
    if ( topvi >= topv_count )
      return false;
    const ON_MeshTopologyVertex& topv = m_topv[topvi];
    for ( j = 0; j < topv.m_v_count; j++ ) {
      if ( topv.m_vi[j] == vi )
        break;
    }
    if ( j >= topv.m_v_count )
      return false; // bogus m_topv_map[] array
  }

  // check edges
  for ( topei = 0; topei < tope_count; topei++ ) {
    const ON_MeshTopologyEdge& tope = m_tope[topei];
    if ( tope.m_topvi[0] < 0 || tope.m_topvi[0] >= topv_count )
      return false;
    if ( tope.m_topvi[1] < 0 || tope.m_topvi[1] >= topv_count )
      return false;
    if ( tope.m_topvi[0] == tope.m_topvi[1] )
      return false;

    const ON_MeshTopologyVertex& topv0 = m_topv[tope.m_topvi[0]];
    for ( j = 0; j < topv0.m_tope_count; j++ ) {
      if ( topv0.m_topei[j] == topei )
        break;
    }
    if ( j >= topv0.m_tope_count )
      return false; // start vtx not linked to edge

    const ON_MeshTopologyVertex& topv1 = m_topv[tope.m_topvi[1]];
    for ( j = 0; j < topv1.m_tope_count; j++ ) {
      if ( topv1.m_topei[j] == topei )
        break;
    }
    if ( j >= topv1.m_tope_count )
      return false; // end vtx not linked to edge

    if ( tope.m_topf_count < 0 )
      return false;
    if ( tope.m_topf_count == 0 && tope.m_topfi )
      return false; // array should be nullptr
    if ( tope.m_topf_count > 0 && !tope.m_topfi )
      return false; // array should not be nullptr
    for ( j = 0; j < tope.m_topf_count; j++ ) {
      fi = tope.m_topfi[j];
      if ( fi < 0 || fi >= f_count )
        return false;
      const ON_MeshTopologyFace& topf = m_topf[fi];
      for ( k = 0; k < 4; k++ ) {
        if ( topf.m_topei[k] == topei )
          break;
      }
      if ( k >= 4 )
        return false; // edge not in face's list
    }
  }

  // check faces
  for ( fi = 0; fi < f_count; fi++ ) {
    topfi = fi;
    const ON_MeshTopologyFace& topf = m_topf[topfi];
    const ON_MeshFace& f = m_mesh->m_F[fi];
    if ( topf.m_topei[0] < 0 || topf.m_topei[0] >= tope_count )
      return false;
    if ( topf.m_topei[1] < 0 || topf.m_topei[1] >= tope_count )
      return false;
    if ( topf.m_topei[2] < 0 || topf.m_topei[2] >= tope_count )
      return false;
    if ( topf.m_topei[3] < 0 || topf.m_topei[3] >= tope_count )
      return false;
    tfvi[0] = m_topv_map[f.vi[0]];
    tfvi[1] = m_topv_map[f.vi[1]];
    tfvi[2] = m_topv_map[f.vi[2]];
    tfvi[3] = m_topv_map[f.vi[3]];
    if (    topf.m_topei[0] != 0 || topf.m_topei[1] != 0 
         || topf.m_topei[2] != 0 || topf.m_topei[3] != 0 ) {
      if ( !f.IsValid(v_count) )
        return false;
      if ( f.IsTriangle() ) {
        if (topf.m_topei[2] != topf.m_topei[3] )
          return false;
        jmax = 3;
      }
      else {
        if (topf.m_topei[2] == topf.m_topei[3] )
          return false;
        jmax = 4;
      }
      for ( j = 0; j < jmax; j++ ) {
        const ON_MeshTopologyEdge& tope = m_tope[topf.m_topei[j]];
        for ( k = 0; k < tope.m_topf_count; k++ ) {
          if ( tope.m_topfi[k] == topfi )
            break;
        }
        if ( k >= tope.m_topf_count )
          return false;

        // topedge m_tope[topf.m_topei[j]] ENDS at topvtx m_topv[tfvi[j]]
        if ( topf.m_reve[j] ) {
          if ( tope.m_topvi[1] != tfvi[(j+3)%4] )
            return false;
          if ( tope.m_topvi[0] != tfvi[j] )
            return false;
        }
        else {
          if ( tope.m_topvi[0] != tfvi[(j+3)%4] )
            return false;
          if ( tope.m_topvi[1] != tfvi[j] )
            return false;
        }
      }      
    }
    else {
      // all topf.m_topei[] must be zeros
      if (    topf.m_topei[0] != 0 || topf.m_topei[1] != 0 
           || topf.m_topei[2] != 0 || topf.m_topei[3] != 0 )
        return false;
    }
  }
  return true;
}